

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicCounter.h
# Opt level: O0

void __thiscall aeron::concurrent::AtomicCounter::~AtomicCounter(AtomicCounter *this)

{
  bool bVar1;
  element_type *this_00;
  undefined8 *in_RDI;
  shared_ptr<aeron::concurrent::CountersManager> *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__AtomicCounter_0022daf8;
  bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffffe8);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<aeron::concurrent::CountersManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<aeron::concurrent::CountersManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1edfa2);
    CountersManager::free(this_00,(void *)(ulong)*(uint *)(in_RDI + 4));
  }
  std::shared_ptr<aeron::concurrent::CountersManager>::~shared_ptr
            ((shared_ptr<aeron::concurrent::CountersManager> *)0x1edfc4);
  AtomicBuffer::~AtomicBuffer((AtomicBuffer *)(in_RDI + 1));
  return;
}

Assistant:

virtual ~AtomicCounter()
    {
        if (nullptr != m_countersManager)
        {
            m_countersManager->free(m_counterId);
        }
    }